

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# touch.cpp
# Opt level: O0

bool fs_touch(string_view path)

{
  string_view path_00;
  bool bVar1;
  const_pointer pvVar2;
  string_view local_260;
  size_t local_250;
  char *local_248;
  uint local_240;
  long local_230;
  ofstream f;
  undefined1 local_20 [8];
  string_view path_local;
  
  path_local._M_len = (size_t)path._M_str;
  local_20 = (undefined1  [8])path._M_len;
  bVar1 = fs_set_modtime(path,true);
  if (bVar1) {
    path_local._M_str._7_1_ = 1;
  }
  else {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
    std::ofstream::ofstream(&local_230,pvVar2,_S_out);
    bVar1 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&local_230 + *(long *)(local_230 + -0x18)));
    if (bVar1) {
      std::ofstream::close();
      path_local._M_str._7_1_ = 1;
    }
    local_240 = (uint)bVar1;
    std::ofstream::~ofstream(&local_230);
    if (local_240 == 0) {
      local_250 = (size_t)local_20;
      local_248 = (char *)path_local._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_260,"fs_touch");
      path_00._M_str = local_248;
      path_00._M_len = local_250;
      fs_print_error(path_00,local_260);
      path_local._M_str._7_1_ = 0;
    }
  }
  return (bool)(path_local._M_str._7_1_ & 1);
}

Assistant:

bool fs_touch(std::string_view path)
{
  if(fs_set_modtime(path, true))
    return true;

  if(std::ofstream f(path.data()); f){
    f.close();
    return true;
  }

  fs_print_error(path, __func__);
  return false;
}